

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

bool __thiscall helics::CommonCore::isOpenToNewFederates(CommonCore *this)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  BrokerState BVar4;
  long in_RDI;
  bool bVar5;
  BrokerState cBrokerState;
  shared_guarded<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  *this_00;
  bool local_51;
  bool local_45;
  undefined1 local_30 [48];
  
  local_30._30_2_ = BrokerBase::getBrokerState((BrokerBase *)0x48cf4c);
  bVar5 = false;
  local_45 = false;
  if (local_30._30_2_ != CREATED) {
    BVar4 = OPERATING;
    if ((*(byte *)(in_RDI + 0xdf) & 1) != 0) {
      BVar4 = TERMINATING;
    }
    local_45 = false;
    if ((short)local_30._30_2_ < BVar4) {
      iVar1 = *(int *)(in_RDI + 0x28);
      iVar2 = CLI::std::numeric_limits<int>::max();
      bVar5 = iVar1 != iVar2;
      local_51 = true;
      if (bVar5) {
        this_00 = (shared_guarded<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
                   *)local_30;
        gmlc::libguarded::
        shared_guarded<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
        ::lock_shared(this_00);
        gmlc::libguarded::
        shared_lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
        ::operator->((shared_lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
                      *)this_00);
        sVar3 = gmlc::containers::
                MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::size((MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x48cfe9);
        local_51 = sVar3 < (ulong)(long)*(int *)(in_RDI + 0x28);
      }
      local_45 = local_51;
    }
  }
  local_30[0x2f] = local_45;
  if (bVar5) {
    gmlc::libguarded::
    shared_lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
    ::~shared_lock_handle
              ((shared_lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
                *)0x48d02d);
  }
  return (bool)(local_30[0x2f] & 1);
}

Assistant:

bool CommonCore::isOpenToNewFederates() const
{
    auto cBrokerState = getBrokerState();
    return (
        (cBrokerState != BrokerState::CREATED) &&
        (cBrokerState < (dynamicFederation ? BrokerState::TERMINATING : BrokerState::OPERATING)) &&
        (maxFederateCount == std::numeric_limits<int32_t>::max() ||
         (federates.lock_shared()->size() < static_cast<size_t>(maxFederateCount))));
}